

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  undefined8 *puVar1;
  uchar uVar2;
  short sVar3;
  undefined8 uVar4;
  long lVar5;
  short sVar6;
  _func_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int *p_Var7;
  byte bVar8;
  byte bVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  undefined1 uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  stbi__uint32 sVar19;
  stbi__uint32 sVar20;
  stbi__uint32 sVar21;
  int iVar22;
  uint uVar23;
  stbi__uint32 sVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  uchar *puVar31;
  float *__ptr;
  stbi_uc *psVar32;
  void *pvVar33;
  code *pcVar34;
  uchar *puVar35;
  undefined8 *puVar36;
  stbi_uc *psVar37;
  stbi__context *psVar38;
  undefined8 *puVar39;
  ulong uVar40;
  ulong uVar41;
  short sVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  float *pfVar46;
  int id;
  uint uVar47;
  ulong uVar48;
  stbi_uc **ppsVar49;
  int iVar50;
  int iVar51;
  stbi__uint32 z;
  uint uVar52;
  ulong uVar53;
  long lVar54;
  bool bVar55;
  anon_struct_96_18_0d0905d3 *paVar56;
  int iVar57;
  short *psVar58;
  stbi_uc *psVar59;
  int iVar60;
  ulong uVar61;
  undefined1 *puVar62;
  uint uVar63;
  stbi__context *psVar64;
  byte *pbVar65;
  bool bVar66;
  float fVar67;
  float fVar68;
  uchar *local_4a08;
  stbi_uc *local_49e8;
  uint local_49e0;
  int local_49b4;
  uint local_4994;
  int local_498c;
  int local_4988;
  int local_4984;
  int local_497c;
  stbi_uc *coutput [4];
  short data [64];
  stbi__jpeg j;
  
  uVar40 = (ulong)(uint)req_comp;
  j.idct_block_kernel = stbi__idct_block;
  j.YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_row;
  j.resample_row_hv_2_kernel = stbi__resample_row_hv_2;
  j.s = s;
  iVar16 = stbi__decode_jpeg_header(&j,1);
  s->img_buffer = s->img_buffer_original;
  if (iVar16 != 0) {
    j.idct_block_kernel = stbi__idct_block;
    j.YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_row;
    j.resample_row_hv_2_kernel = stbi__resample_row_hv_2;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar30 = 0x45d8; lVar30 != 0x4758; lVar30 = lVar30 + 0x60) {
        psVar37 = j.huff_dc[0].fast + lVar30 + -8;
        psVar37[0] = '\0';
        psVar37[1] = '\0';
        psVar37[2] = '\0';
        psVar37[3] = '\0';
        psVar37[4] = '\0';
        psVar37[5] = '\0';
        psVar37[6] = '\0';
        psVar37[7] = '\0';
        psVar37 = j.huff_dc[0].fast + lVar30;
        psVar37[0] = '\0';
        psVar37[1] = '\0';
        psVar37[2] = '\0';
        psVar37[3] = '\0';
        psVar37[4] = '\0';
        psVar37[5] = '\0';
        psVar37[6] = '\0';
        psVar37[7] = '\0';
      }
      j.restart_interval = 0;
      j.s = s;
      iVar16 = stbi__decode_jpeg_header(&j,0);
      if (iVar16 == 0) {
LAB_0010d3f3:
        stbi__cleanup_jpeg(&j);
        return (uchar *)0x0;
      }
      bVar8 = stbi__get_marker(&j);
LAB_0010b6ad:
      if (bVar8 == 0xda) {
        iVar16 = stbi__get16be(j.s);
        bVar8 = stbi__get8(j.s);
        j.scan_n = (int)bVar8;
        if (((byte)(bVar8 - 5) < 0xfc) || ((j.s)->img_n < (int)(uint)bVar8)) {
          stbi__g_failure_reason = "bad SOS component count";
        }
        else {
          if (iVar16 == (uint)bVar8 * 2 + 6) {
            lVar30 = 0;
            while( true ) {
              paVar56 = j.img_comp;
              lVar54 = (long)j.scan_n;
              bVar8 = stbi__get8(j.s);
              if (lVar54 <= lVar30) break;
              bVar9 = stbi__get8(j.s);
              uVar63 = (j.s)->img_n;
              uVar48 = 0;
              if (0 < (int)uVar63) {
                uVar48 = (ulong)uVar63;
              }
              for (uVar53 = 0; uVar48 != uVar53; uVar53 = uVar53 + 1) {
                if (paVar56->id == (uint)bVar8) {
                  uVar48 = uVar53 & 0xffffffff;
                  break;
                }
                paVar56 = paVar56 + 1;
              }
              if ((uint)uVar48 == uVar63) goto LAB_0010d3f3;
              j.img_comp[uVar48].hd = (uint)(bVar9 >> 4);
              if (0x3f < bVar9) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_0010d3f3;
              }
              j.img_comp[uVar48].ha = bVar9 & 0xf;
              if (3 < (bVar9 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_0010d3f3;
              }
              j.order[lVar30] = (uint)uVar48;
              lVar30 = lVar30 + 1;
            }
            j.spec_start = (uint)bVar8;
            bVar8 = stbi__get8(j.s);
            j.spec_end = (int)bVar8;
            bVar8 = stbi__get8(j.s);
            iVar16 = j.order[0];
            j.succ_high = (uint)(bVar8 >> 4);
            j.succ_low = bVar8 & 0xf;
            if (j.progressive == 0) {
              if ((j.spec_start != 0) || ((0xf < bVar8 || ((bVar8 & 0xf) != 0)))) {
LAB_0010cfff:
                stbi__g_failure_reason = "bad SOS";
                goto LAB_0010d3f3;
              }
              j.spec_end = 0x3f;
            }
            else if ((((0x3f < j.spec_start) || (0x3f < j.spec_end)) || (j.spec_end < j.spec_start))
                    || ((0xdf < bVar8 || (0xd < (bVar8 & 0xf))))) goto LAB_0010cfff;
            j.code_buffer = 0;
            j.code_bits = 0;
            j.nomore = 0;
            j.img_comp[2].dc_pred = 0;
            j.img_comp[1].dc_pred = 0;
            j.img_comp[0].dc_pred = 0;
            j.todo = j.restart_interval;
            if (j.restart_interval == 0) {
              j.todo = 0x7fffffff;
            }
            j.eob_run = 0;
            j.marker = 0xff;
            if (j.progressive == 0) {
              if (j.scan_n == 1) {
                lVar30 = (long)j.order[0];
                uVar23 = j.img_comp[lVar30].x + 7 >> 3;
                uVar63 = j.img_comp[lVar30].y + 7 >> 3;
                uVar53 = 0;
                uVar48 = (ulong)uVar23;
                if ((int)uVar23 < 1) {
                  uVar48 = uVar53;
                }
                uVar61 = (ulong)uVar63;
                if ((int)uVar63 < 1) {
                  uVar61 = uVar53;
                }
                for (iVar57 = 0; iVar57 != (int)uVar61; iVar57 = iVar57 + 1) {
                  for (lVar54 = 0; uVar48 * 8 != lVar54; lVar54 = lVar54 + 8) {
                    iVar22 = j.img_comp[lVar30].ha;
                    iVar22 = stbi__jpeg_decode_block
                                       (&j,data,j.huff_dc + j.img_comp[lVar30].hd,j.huff_ac + iVar22
                                        ,j.fast_ac[iVar22],iVar16,j.dequant[j.img_comp[lVar30].tq]);
                    if (iVar22 == 0) goto LAB_0010c287;
                    iVar22 = j.img_comp[lVar30].w2;
                    (*j.idct_block_kernel)
                              (j.img_comp[lVar30].data + lVar54 + (int)uVar53 * iVar22,iVar22,data);
                    iVar22 = j.todo;
                    j.todo = j.todo + -1;
                    if (iVar22 < 2) {
                      if (j.code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(&j);
                      }
                      if ((j.marker & 0xf8) != 0xd0) goto LAB_0010c2ed;
                      j.code_buffer = 0;
                      j.code_bits = 0;
                      j.nomore = 0;
                      j.img_comp[2].dc_pred = 0;
                      j.img_comp[1].dc_pred = 0;
                      j.img_comp[0].dc_pred = 0;
                      j.marker = 0xff;
                      j.todo = j.restart_interval;
                      if (j.restart_interval == 0) {
                        j.todo = 0x7fffffff;
                      }
                      j.eob_run = 0;
                    }
                  }
                  uVar53 = (ulong)((int)uVar53 + 8);
                }
              }
              else {
                for (iVar16 = 0; iVar16 < j.img_mcu_y; iVar16 = iVar16 + 1) {
                  for (iVar57 = 0; iVar57 < j.img_mcu_x; iVar57 = iVar57 + 1) {
                    for (lVar30 = 0; iVar22 = j.todo, lVar30 < j.scan_n; lVar30 = lVar30 + 1) {
                      iVar22 = j.order[lVar30];
                      for (iVar50 = 0; iVar50 < j.img_comp[iVar22].v; iVar50 = iVar50 + 1) {
                        for (iVar51 = 0; iVar17 = j.img_comp[iVar22].h, iVar51 < iVar17;
                            iVar51 = iVar51 + 1) {
                          iVar60 = j.img_comp[iVar22].v;
                          iVar18 = j.img_comp[iVar22].ha;
                          iVar18 = stbi__jpeg_decode_block
                                             (&j,data,j.huff_dc + j.img_comp[iVar22].hd,
                                              j.huff_ac + iVar18,j.fast_ac[iVar18],iVar22,
                                              j.dequant[j.img_comp[iVar22].tq]);
                          if (iVar18 == 0) goto LAB_0010c287;
                          iVar18 = j.img_comp[iVar22].w2;
                          (*j.idct_block_kernel)
                                    (j.img_comp[iVar22].data +
                                     (long)((iVar17 * iVar57 + iVar51) * 8) +
                                     (long)((iVar60 * iVar16 + iVar50) * iVar18 * 8),iVar18,data);
                        }
                      }
                    }
                    j.todo = j.todo + -1;
                    if (iVar22 < 2) {
                      if (j.code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(&j);
                      }
                      if ((j.marker & 0xf8) != 0xd0) goto LAB_0010c2ed;
                      j.code_buffer = 0;
                      j.code_bits = 0;
                      j.nomore = 0;
                      j.img_comp[2].dc_pred = 0;
                      j.img_comp[1].dc_pred = 0;
                      j.img_comp[0].dc_pred = 0;
                      j.marker = 0xff;
                      j.todo = j.restart_interval;
                      if (j.restart_interval == 0) {
                        j.todo = 0x7fffffff;
                      }
                      j.eob_run = 0;
                    }
                  }
                }
              }
LAB_0010c2ed:
              bVar66 = true;
              goto LAB_0010c289;
            }
            if (j.scan_n == 1) {
              lVar30 = (long)j.order[0];
              iVar57 = j.img_comp[lVar30].x + 7 >> 3;
              iVar22 = j.img_comp[lVar30].y + 7 >> 3;
              iVar50 = 0;
              if (iVar57 < 1) {
                iVar57 = iVar50;
              }
              if (iVar22 < 1) {
                iVar22 = iVar50;
              }
              for (; iVar50 != iVar22; iVar50 = iVar50 + 1) {
                for (iVar51 = 0; iVar51 != iVar57; iVar51 = iVar51 + 1) {
                  psVar58 = j.img_comp[lVar30].coeff +
                            (j.img_comp[lVar30].coeff_w * iVar50 + iVar51) * 0x40;
                  uVar48 = (ulong)j.spec_start;
                  if (uVar48 == 0) {
                    iVar17 = stbi__jpeg_decode_block_prog_dc
                                       (&j,psVar58,j.huff_dc + j.img_comp[lVar30].hd,iVar16);
                    if (iVar17 == 0) goto LAB_0010d3f3;
                  }
                  else {
                    iVar17 = j.img_comp[lVar30].ha;
                    bVar8 = (byte)j.succ_low;
                    if (j.succ_high == 0) {
                      if (j.eob_run == 0) {
                        do {
                          if (j.code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(&j);
                          }
                          sVar42 = j.fast_ac[iVar17][j.code_buffer >> 0x17];
                          uVar63 = (uint)sVar42;
                          iVar60 = (int)uVar48;
                          if (sVar42 == 0) {
                            uVar63 = stbi__jpeg_huff_decode(&j,j.huff_ac + iVar17);
                            if ((int)uVar63 < 0) goto LAB_0010c980;
                            uVar23 = uVar63 >> 4;
                            if ((uVar63 & 0xf) == 0) {
                              if (uVar63 < 0xf0) {
                                j.eob_run = 1 << ((byte)uVar23 & 0x1f);
                                if (0xf < uVar63) {
                                  iVar17 = stbi__jpeg_get_bits(&j,uVar23);
                                  j.eob_run = iVar17 + j.eob_run;
                                }
                                goto LAB_0010ba8f;
                              }
                              uVar48 = (ulong)(iVar60 + 0x10);
                            }
                            else {
                              lVar54 = (ulong)uVar23 + (long)iVar60;
                              uVar48 = (ulong)((int)lVar54 + 1);
                              bVar9 = ""[lVar54];
                              iVar60 = stbi__extend_receive(&j,uVar63 & 0xf);
                              psVar58[bVar9] = (short)(iVar60 << (bVar8 & 0x1f));
                            }
                          }
                          else {
                            lVar54 = (ulong)(uVar63 >> 4 & 0xf) + (long)iVar60;
                            j.code_bits = j.code_bits - (uVar63 & 0xf);
                            j.code_buffer = j.code_buffer << (sbyte)(uVar63 & 0xf);
                            uVar48 = (ulong)((int)lVar54 + 1);
                            psVar58[""[lVar54]] = (short)((uVar63 >> 8) << (bVar8 & 0x1f));
                          }
                        } while ((int)uVar48 <= j.spec_end);
                      }
                      else {
LAB_0010ba8f:
                        j.eob_run = j.eob_run + -1;
                      }
                    }
                    else if (j.eob_run == 0) {
                      iVar60 = 0x10000 << (bVar8 & 0x1f);
                      do {
                        uVar63 = stbi__jpeg_huff_decode(&j,j.huff_ac + iVar17);
                        if ((int)uVar63 < 0) goto LAB_0010c980;
                        uVar23 = uVar63 >> 4;
                        if ((uVar63 & 0xf) == 1) {
                          iVar18 = stbi__jpeg_get_bit(&j);
                          iVar43 = 1;
                          if (iVar18 == 0) {
                            iVar43 = 0xffff;
                          }
                          sVar42 = (short)(iVar43 << (bVar8 & 0x1f));
                        }
                        else {
                          if ((uVar63 & 0xf) != 0) goto LAB_0010c980;
                          if (uVar63 < 0xf0) {
                            j.eob_run = ~(-1 << ((byte)uVar23 & 0x1f));
                            if (0xf < uVar63) {
                              iVar18 = stbi__jpeg_get_bits(&j,uVar23);
                              j.eob_run = j.eob_run + iVar18;
                            }
                            uVar23 = 0x40;
                          }
                          else {
                            uVar23 = 0xf;
                          }
                          sVar42 = 0;
                        }
                        uVar53 = (long)(int)uVar48;
                        do {
                          while( true ) {
                            uVar48 = uVar53;
                            if ((long)j.spec_end < (long)uVar48) goto LAB_0010bbbd;
                            bVar9 = ""[uVar48];
                            if (psVar58[bVar9] == 0) break;
                            iVar18 = stbi__jpeg_get_bit(&j);
                            if ((iVar18 != 0) &&
                               (sVar3 = psVar58[bVar9], (iVar60 >> 0x10 & (int)sVar3) == 0)) {
                              sVar6 = (short)((uint)iVar60 >> 0x10);
                              if (sVar3 < 1) {
                                sVar6 = -sVar6;
                              }
                              psVar58[bVar9] = sVar3 + sVar6;
                            }
                            uVar53 = uVar48 + 1;
                          }
                          bVar66 = uVar23 != 0;
                          uVar23 = uVar23 - 1;
                          uVar53 = uVar48 + 1;
                        } while (bVar66);
                        psVar58[bVar9] = sVar42;
                        uVar48 = uVar48 + 1;
LAB_0010bbbd:
                      } while ((int)uVar48 <= j.spec_end);
                    }
                    else {
                      j.eob_run = j.eob_run + -1;
                      uVar63 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                      for (; (long)uVar48 <= (long)j.spec_end; uVar48 = uVar48 + 1) {
                        bVar8 = ""[uVar48];
                        if (((psVar58[bVar8] != 0) && (iVar17 = stbi__jpeg_get_bit(&j), iVar17 != 0)
                            ) && (sVar42 = psVar58[bVar8], (uVar63 & (int)sVar42) == 0)) {
                          uVar23 = -uVar63;
                          if (0 < sVar42) {
                            uVar23 = uVar63;
                          }
                          psVar58[bVar8] = (short)uVar23 + sVar42;
                        }
                      }
                    }
                  }
                  iVar17 = j.todo;
                  j.todo = j.todo + -1;
                  if (iVar17 < 2) {
                    if (j.code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(&j);
                    }
                    if ((j.marker & 0xf8) != 0xd0) goto LAB_0010c298;
                    j.code_buffer = 0;
                    j.code_bits = 0;
                    j.nomore = 0;
                    j.img_comp[2].dc_pred = 0;
                    j.img_comp[1].dc_pred = 0;
                    j.img_comp[0].dc_pred = 0;
                    j.marker = 0xff;
                    j.todo = j.restart_interval;
                    if (j.restart_interval == 0) {
                      j.todo = 0x7fffffff;
                    }
                    j.eob_run = 0;
                  }
                }
              }
            }
            else {
              for (iVar16 = 0; iVar16 < j.img_mcu_y; iVar16 = iVar16 + 1) {
                for (iVar57 = 0; iVar57 < j.img_mcu_x; iVar57 = iVar57 + 1) {
                  for (lVar30 = 0; iVar22 = j.todo, lVar30 < j.scan_n; lVar30 = lVar30 + 1) {
                    iVar22 = j.order[lVar30];
                    for (iVar50 = 0; iVar50 < j.img_comp[iVar22].v; iVar50 = iVar50 + 1) {
                      iVar51 = 0;
                      while (iVar17 = j.img_comp[iVar22].h, iVar51 < iVar17) {
                        iVar17 = stbi__jpeg_decode_block_prog_dc
                                           (&j,j.img_comp[iVar22].coeff +
                                               (iVar17 * iVar57 + iVar51 +
                                               (j.img_comp[iVar22].v * iVar16 + iVar50) *
                                               j.img_comp[iVar22].coeff_w) * 0x40,
                                            j.huff_dc + j.img_comp[iVar22].hd,iVar22);
                        iVar51 = iVar51 + 1;
                        if (iVar17 == 0) goto LAB_0010d3f3;
                      }
                    }
                  }
                  j.todo = j.todo + -1;
                  if (iVar22 < 2) {
                    if (j.code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(&j);
                    }
                    if ((j.marker & 0xf8) != 0xd0) goto LAB_0010c298;
                    j.code_buffer = 0;
                    j.code_bits = 0;
                    j.nomore = 0;
                    j.img_comp[2].dc_pred = 0;
                    j.img_comp[1].dc_pred = 0;
                    j.img_comp[0].dc_pred = 0;
                    j.marker = 0xff;
                    j.todo = j.restart_interval;
                    if (j.restart_interval == 0) {
                      j.todo = 0x7fffffff;
                    }
                    j.eob_run = 0;
                  }
                }
              }
            }
            goto LAB_0010c298;
          }
          stbi__g_failure_reason = "bad SOS len";
        }
        goto LAB_0010d3f3;
      }
      if (bVar8 != 0xd9) {
        iVar16 = stbi__process_marker(&j,(uint)bVar8);
        if (iVar16 != 0) goto LAB_0010b6d5;
        goto LAB_0010d3f3;
      }
      if (j.progressive == 0) {
        uVar63 = (j.s)->img_n;
      }
      else {
        for (lVar30 = 0; uVar63 = (j.s)->img_n, lVar30 < (int)uVar63; lVar30 = lVar30 + 1) {
          uVar63 = j.img_comp[lVar30].x + 7 >> 3;
          iVar16 = j.img_comp[lVar30].y + 7 >> 3;
          iVar57 = 0;
          if ((int)uVar63 < 1) {
            uVar63 = 0;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          for (; iVar57 != iVar16; iVar57 = iVar57 + 1) {
            for (uVar48 = 0; uVar48 != uVar63; uVar48 = uVar48 + 1) {
              psVar58 = j.img_comp[lVar30].coeff;
              iVar50 = j.img_comp[lVar30].coeff_w * iVar57;
              iVar22 = j.img_comp[lVar30].tq;
              iVar51 = iVar50 + (int)uVar48;
              for (lVar54 = 0; lVar54 != 0x40; lVar54 = lVar54 + 1) {
                psVar58[iVar51 * 0x40 + lVar54] =
                     (ushort)j.dequant[iVar22][lVar54] * psVar58[iVar51 * 0x40 + lVar54];
              }
              iVar22 = j.img_comp[lVar30].w2;
              (*j.idct_block_kernel)
                        (j.img_comp[lVar30].data + uVar48 * 8 + (long)(iVar57 * 8 * iVar22),iVar22,
                         psVar58 + (iVar50 + (int)uVar48) * 0x40);
            }
          }
        }
      }
      p_Var7 = j.resample_row_hv_2_kernel;
      psVar38 = j.s;
      if (req_comp == 0) {
        uVar40 = (ulong)uVar63;
      }
      lVar30 = 0;
      uVar48 = 0;
      if (0 < (int)uVar63) {
        uVar48 = (ulong)uVar63;
      }
      iVar16 = (int)uVar40;
      uVar53 = 1;
      if (2 < iVar16) {
        uVar53 = uVar48;
      }
      if (uVar63 != 3) {
        uVar53 = uVar48;
      }
      for (; uVar53 * 0x30 != lVar30; lVar30 = lVar30 + 0x30) {
        sVar19 = psVar38->img_x;
        pvVar33 = malloc((ulong)(sVar19 + 3));
        *(void **)((long)&j.img_comp[0].linebuf + lVar30 * 2) = pvVar33;
        if (pvVar33 == (void *)0x0) goto LAB_0010d3cc;
        uVar48 = (long)j.img_h_max / (long)*(int *)((long)&j.img_comp[0].h + lVar30 * 2);
        iVar57 = (int)uVar48;
        *(int *)((long)data + lVar30 + 0x18) = iVar57;
        iVar22 = j.img_v_max / *(int *)((long)&j.img_comp[0].v + lVar30 * 2);
        *(int *)((long)data + lVar30 + 0x1c) = iVar22;
        *(int *)((long)data + lVar30 + 0x24) = iVar22 >> 1;
        *(int *)((long)data + lVar30 + 0x20) =
             (int)((ulong)((iVar57 + sVar19) - 1) / (uVar48 & 0xffffffff));
        *(undefined4 *)((long)data + lVar30 + 0x28) = 0;
        uVar4 = *(undefined8 *)((long)&j.img_comp[0].data + lVar30 * 2);
        *(undefined8 *)((long)data + lVar30 + 0x10) = uVar4;
        *(undefined8 *)((long)data + lVar30 + 8) = uVar4;
        if (iVar57 == 2) {
          pcVar34 = stbi__resample_row_h_2;
          if ((iVar22 != 1) && (pcVar34 = p_Var7, iVar22 != 2)) goto LAB_0010d18b;
        }
        else if (iVar57 == 1) {
          pcVar34 = stbi__resample_row_generic;
          if (iVar22 == 2) {
            pcVar34 = stbi__resample_row_v_2;
          }
          if (iVar22 == 1) {
            pcVar34 = resample_row_1;
          }
        }
        else {
LAB_0010d18b:
          pcVar34 = stbi__resample_row_generic;
        }
        *(code **)((long)data + lVar30) = pcVar34;
      }
      uVar63 = psVar38->img_y;
      puVar35 = (uchar *)malloc((ulong)(psVar38->img_x * iVar16 * uVar63 + 1));
      if (puVar35 != (uchar *)0x0) {
        iVar57 = 0;
        for (uVar23 = 0; uVar23 < uVar63; uVar23 = uVar23 + 1) {
          sVar19 = psVar38->img_x;
          ppsVar49 = coutput;
          for (lVar30 = 0; uVar53 * 0x30 != lVar30; lVar30 = lVar30 + 0x30) {
            puVar36 = (undefined8 *)((long)data + lVar30 + 0x10);
            iVar22 = *(int *)((long)data + lVar30 + 0x24);
            iVar50 = *(int *)((long)data + lVar30 + 0x1c);
            iVar51 = iVar50 >> 1;
            puVar1 = (undefined8 *)((long)data + lVar30 + 8);
            puVar39 = puVar36;
            if (iVar22 < iVar51) {
              puVar39 = puVar1;
            }
            if (iVar51 <= iVar22) {
              puVar36 = puVar1;
            }
            psVar37 = (stbi_uc *)
                      (**(code **)((long)data + lVar30))
                                (*(undefined8 *)((long)&j.img_comp[0].linebuf + lVar30 * 2),*puVar39
                                 ,*puVar36,*(undefined4 *)((long)data + lVar30 + 0x20),
                                 *(undefined4 *)((long)data + lVar30 + 0x18));
            *ppsVar49 = psVar37;
            *(int *)((long)data + lVar30 + 0x24) = iVar22 + 1;
            if (iVar50 <= iVar22 + 1) {
              *(undefined4 *)((long)data + lVar30 + 0x24) = 0;
              lVar54 = *(long *)((long)data + lVar30 + 0x10);
              *(long *)((long)data + lVar30 + 8) = lVar54;
              iVar22 = *(int *)((long)data + lVar30 + 0x28) + 1;
              *(int *)((long)data + lVar30 + 0x28) = iVar22;
              if (iVar22 < *(int *)((long)&j.img_comp[0].y + lVar30 * 2)) {
                *(long *)((long)data + lVar30 + 0x10) =
                     lVar54 + *(int *)((long)&j.img_comp[0].w2 + lVar30 * 2);
              }
            }
            ppsVar49 = ppsVar49 + 1;
          }
          if (iVar16 < 3) {
            if (iVar16 == 1) {
              for (uVar48 = 0; uVar48 < (j.s)->img_x; uVar48 = uVar48 + 1) {
                puVar35[uVar48 + sVar19 * iVar57] = coutput[0][uVar48];
              }
            }
            else {
              for (uVar48 = 0; uVar48 < (j.s)->img_x; uVar48 = uVar48 + 1) {
                puVar35[uVar48 * 2 + (ulong)(sVar19 * iVar57)] = coutput[0][uVar48];
                puVar35[uVar48 * 2 + (ulong)(sVar19 * iVar57) + 1] = 0xff;
              }
            }
          }
          else if ((j.s)->img_n == 3) {
            (*j.YCbCr_to_RGB_kernel)
                      (puVar35 + uVar23 * iVar16 * sVar19,coutput[0],coutput[1],coutput[2],
                       (j.s)->img_x,iVar16);
          }
          else {
            puVar62 = puVar35 + (ulong)(sVar19 * iVar57) + 3;
            for (uVar48 = 0; uVar48 < (j.s)->img_x; uVar48 = uVar48 + 1) {
              sVar10 = coutput[0][uVar48];
              puVar62[-1] = sVar10;
              puVar62[-2] = sVar10;
              puVar62[-3] = sVar10;
              *puVar62 = 0xff;
              puVar62 = puVar62 + uVar40;
            }
          }
          uVar63 = (j.s)->img_y;
          iVar57 = iVar57 + iVar16;
          psVar38 = j.s;
        }
        stbi__cleanup_jpeg(&j);
        *x = (j.s)->img_x;
        *y = (j.s)->img_y;
        if (comp != (int *)0x0) {
          *comp = (j.s)->img_n;
          return puVar35;
        }
        return puVar35;
      }
LAB_0010d3cc:
      stbi__cleanup_jpeg(&j);
      goto LAB_0010d3d9;
    }
LAB_0010b655:
    stbi__g_failure_reason = "bad req_comp";
    return (uchar *)0x0;
  }
  iVar16 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  if (iVar16 != 0) {
    if ((uint)req_comp < 5) {
      j.s = s;
      iVar16 = stbi__parse_png_file((stbi__png *)&j,0,req_comp);
      psVar38 = j.s;
      puVar35 = (uchar *)CONCAT44(j.huff_dc[0].fast._20_4_,j.huff_dc[0].fast._16_4_);
      if (iVar16 == 0) {
        puVar31 = (uchar *)0x0;
      }
      else {
        puVar31 = puVar35;
        if ((req_comp != 0) && ((j.s)->img_out_n != req_comp)) {
          puVar31 = stbi__convert_format
                              (puVar35,(j.s)->img_out_n,req_comp,(j.s)->img_x,(j.s)->img_y);
          psVar38->img_out_n = req_comp;
          if (puVar31 == (uchar *)0x0) {
            return (uchar *)0x0;
          }
        }
        *x = psVar38->img_x;
        *y = psVar38->img_y;
        if (comp != (int *)0x0) {
          *comp = psVar38->img_out_n;
        }
        puVar35 = (uchar *)0x0;
      }
      free(puVar35);
      free((void *)CONCAT44(j.huff_dc[0].fast._12_4_,j.huff_dc[0].fast._8_4_));
      free((void *)j.huff_dc[0].fast._0_8_);
      return puVar31;
    }
    goto LAB_0010b655;
  }
  sVar10 = stbi__get8(s);
  if ((sVar10 != 'B') || (sVar10 = stbi__get8(s), sVar10 != 'M')) {
    s->img_buffer = s->img_buffer_original;
LAB_0010c447:
    sVar10 = stbi__get8(s);
    if ((((sVar10 == 'G') && (sVar10 = stbi__get8(s), sVar10 == 'I')) &&
        ((sVar10 = stbi__get8(s), sVar10 == 'F' && (sVar10 = stbi__get8(s), sVar10 == '8')))) &&
       ((sVar10 = stbi__get8(s), sVar10 == '7' || (sVar10 == '9')))) {
      sVar10 = stbi__get8(s);
      s->img_buffer = s->img_buffer_original;
      if (sVar10 == 'a') {
        memset((stbi__gif *)&j,0,0x4858);
        iVar16 = stbi__gif_header(s,(stbi__gif *)&j,comp,0);
        psVar38 = (stbi__context *)0x0;
        if (iVar16 == 0) goto LAB_0010d7b6;
        iVar57 = (uint)j.s;
        iVar16 = j.s._4_4_;
        j.huff_dc[0].fast._0_8_ = malloc((long)(int)((uint)j.s * j.s._4_4_ * 4));
        if ((void *)j.huff_dc[0].fast._0_8_ == (void *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          lVar30 = (long)(int)j.huff_dc[0].fast._12_4_;
          for (lVar54 = 0; lVar54 < iVar16 * iVar57 * 4; lVar54 = lVar54 + 4) {
            *(stbi_uc *)(j.huff_dc[0].fast._0_8_ + lVar54) = j.huff_dc[0].fast[lVar30 * 4 + 0x1e];
            *(stbi_uc *)(j.huff_dc[0].fast._0_8_ + lVar54 + 1) =
                 j.huff_dc[0].fast[lVar30 * 4 + 0x1d];
            *(stbi_uc *)(j.huff_dc[0].fast._0_8_ + lVar54 + 2) =
                 j.huff_dc[0].fast[lVar30 * 4 + 0x1c];
            *(stbi_uc *)(j.huff_dc[0].fast._0_8_ + lVar54 + 3) =
                 j.huff_dc[0].fast[lVar30 * 4 + 0x1f];
            iVar57 = (uint)j.s;
            iVar16 = j.s._4_4_;
          }
          while (sVar10 = stbi__get8(s), sVar10 == '!') {
            sVar10 = stbi__get8(s);
            if (sVar10 == 0xf9) {
              bVar8 = stbi__get8(s);
              if (bVar8 == 4) {
                bVar8 = stbi__get8(s);
                j.huff_dc[0].fast._24_4_ = ZEXT14(bVar8);
                stbi__get16le(s);
                bVar8 = stbi__get8(s);
                j.huff_dc[0].fast._20_4_ = ZEXT14(bVar8);
                goto LAB_0010c9dd;
              }
              stbi__skip(s,(uint)bVar8);
            }
            else {
LAB_0010c9dd:
              while (bVar8 = stbi__get8(s), bVar8 != 0) {
                stbi__skip(s,(uint)bVar8);
              }
            }
          }
          psVar38 = s;
          if (sVar10 == ';') goto LAB_0010d7b6;
          if (sVar10 == ',') {
            iVar22 = stbi__get16le(s);
            iVar50 = stbi__get16le(s);
            iVar51 = stbi__get16le(s);
            iVar17 = stbi__get16le(s);
            if ((iVar57 < iVar51 + iVar22) || (iVar16 < iVar17 + iVar50)) {
              stbi__g_failure_reason = "bad Image Descriptor";
            }
            else {
              bVar8 = stbi__get8(s);
              if ((char)bVar8 < '\0') {
                stbi__gif_parse_colortable
                          (s,(stbi_uc (*) [4])(j.huff_dc[0].values + 0x1c),2 << (bVar8 & 7),
                           -(uint)((j.huff_dc[0].fast._24_4_ & 1) == 0) | j.huff_dc[0].fast._20_4_);
              }
              else {
                if ((j.huff_dc[0].fast._8_4_ & 0x80) == 0) {
                  stbi__g_failure_reason = "missing color table";
                  goto LAB_0010ca6b;
                }
                for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 1) {
                  j.huff_dc[0].fast[lVar30 * 4 + 0x1f] = 0xff;
                }
                if ((-1 < (long)(int)j.huff_dc[0].fast._20_4_) &&
                   ((j.huff_dc[0].fast._24_4_ & 1) != 0)) {
                  j.huff_dc[0].fast[(long)(int)j.huff_dc[0].fast._20_4_ * 4 + 0x1f] = '\0';
                }
              }
              bVar8 = stbi__get8(s);
              if (bVar8 < 0xd) {
                uVar63 = 1 << (bVar8 & 0x1f);
                for (uVar40 = 0; uVar63 != uVar40; uVar40 = uVar40 + 1) {
                  j.huff_dc[1].code[uVar40 * 2 + -0x3a] = 0xffff;
                  *(char *)(j.huff_dc[1].code + uVar40 * 2 + -0x39) = (char)uVar40;
                  *(char *)((long)j.huff_dc[1].code + uVar40 * 4 + -0x71) = (char)uVar40;
                }
                uVar28 = (2 << (bVar8 & 0x1f)) - 1;
                uVar47 = 0;
                uVar26 = 0;
                iVar57 = 0;
                bVar66 = false;
                uVar25 = 0xffffffff;
                uVar27 = uVar63 + 2;
                iVar16 = bVar8 + 1;
                uVar23 = uVar28;
                do {
                  while (uVar29 = uVar23, iVar22 = iVar16, uVar44 = uVar27, uVar52 = uVar25,
                        bVar55 = bVar66, iVar16 = iVar57 - iVar22, iVar22 <= iVar57) {
                    uVar23 = (int)uVar26 >> ((byte)iVar22 & 0x1f);
                    uVar45 = uVar26 & uVar29;
                    uVar26 = uVar23;
                    iVar57 = iVar16;
                    bVar66 = true;
                    uVar25 = 0xffffffff;
                    uVar27 = uVar63 + 2;
                    iVar16 = bVar8 + 1;
                    uVar23 = uVar28;
                    if (uVar45 != uVar63) {
                      if (uVar45 == uVar63 + 1) goto LAB_0010e535;
                      if ((int)uVar44 < (int)uVar45) {
LAB_0010e7f2:
                        stbi__g_failure_reason = "illegal code in raster";
                        goto LAB_0010ca6b;
                      }
                      if (!bVar55) {
                        stbi__g_failure_reason = "no clear code";
                        goto LAB_0010ca6b;
                      }
                      if ((int)uVar52 < 0) {
                        if (uVar45 == uVar44) goto LAB_0010e7f2;
                      }
                      else {
                        if (0xfff < (int)uVar44) {
                          stbi__g_failure_reason = "too many codes";
                          goto LAB_0010ca6b;
                        }
                        lVar30 = (long)(int)uVar44;
                        uVar44 = uVar44 + 1;
                        j.huff_dc[1].code[lVar30 * 2 + -0x3a] = (stbi__uint16)uVar52;
                        uVar15 = (undefined1)j.huff_dc[1].code[(ulong)uVar52 * 2 + -0x39];
                        *(undefined1 *)(j.huff_dc[1].code + lVar30 * 2 + -0x39) = uVar15;
                        if (uVar45 != uVar44) {
                          uVar15 = (undefined1)j.huff_dc[1].code[(long)(int)uVar45 * 2 + -0x39];
                        }
                        *(undefined1 *)((long)j.huff_dc[1].code + lVar30 * 4 + -0x71) = uVar15;
                      }
                      stbi__out_gif_code((stbi__gif *)&j,(stbi__uint16)uVar45);
                      iVar16 = iVar22 + 1;
                      uVar23 = ~(-1 << ((byte)iVar16 & 0x1f));
                      if (0xfff < (int)uVar44 || (uVar44 & uVar29) != 0) {
                        uVar23 = uVar29;
                        iVar16 = iVar22;
                      }
                      bVar66 = true;
                      uVar25 = uVar45;
                      uVar27 = uVar44;
                    }
                  }
                  if (uVar47 == 0) {
                    bVar9 = stbi__get8(s);
                    if (bVar9 == 0) goto LAB_0010e54e;
                    uVar47 = (uint)bVar9;
                  }
                  uVar47 = uVar47 - 1;
                  bVar9 = stbi__get8(s);
                  uVar26 = uVar26 | (uint)bVar9 << ((byte)iVar57 & 0x1f);
                  iVar57 = iVar57 + 8;
                  bVar66 = bVar55;
                  uVar25 = uVar52;
                  uVar27 = uVar44;
                  iVar16 = iVar22;
                  uVar23 = uVar29;
                } while( true );
              }
            }
LAB_0010ca6b:
            psVar38 = (stbi__context *)0x0;
            goto LAB_0010d7b6;
          }
          stbi__g_failure_reason = "unknown code";
        }
        psVar38 = (stbi__context *)0x0;
LAB_0010d7b6:
        psVar64 = (stbi__context *)0x0;
        if (psVar38 != s) {
          psVar64 = psVar38;
        }
        if (psVar64 != (stbi__context *)0x0) {
          *x = (uint)j.s;
          *y = j.s._4_4_;
          return (uchar *)psVar64;
        }
        return (uchar *)(stbi__context *)0x0;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
    }
    sVar19 = stbi__get32be(s);
    s->img_buffer = s->img_buffer_original;
    if (sVar19 == 0x38425053) {
      sVar19 = stbi__get32be(s);
      if (sVar19 != 0x38425053) {
        stbi__g_failure_reason = "not PSD";
        return (uchar *)0x0;
      }
      iVar16 = stbi__get16be(s);
      if (iVar16 != 1) {
        stbi__g_failure_reason = "wrong version";
        return (uchar *)0x0;
      }
      stbi__skip(s,6);
      uVar63 = stbi__get16be(s);
      if (0x10 < uVar63) {
        stbi__g_failure_reason = "wrong channel count";
        return (uchar *)0x0;
      }
      sVar19 = stbi__get32be(s);
      sVar20 = stbi__get32be(s);
      iVar16 = stbi__get16be(s);
      if (iVar16 != 8) {
        stbi__g_failure_reason = "unsupported bit depth";
        return (uchar *)0x0;
      }
      iVar16 = stbi__get16be(s);
      if (iVar16 != 3) {
        stbi__g_failure_reason = "wrong color format";
        return (uchar *)0x0;
      }
      sVar21 = stbi__get32be(s);
      stbi__skip(s,sVar21);
      sVar21 = stbi__get32be(s);
      stbi__skip(s,sVar21);
      sVar21 = stbi__get32be(s);
      stbi__skip(s,sVar21);
      uVar23 = stbi__get16be(s);
      if (1 < uVar23) {
        stbi__g_failure_reason = "bad compression";
        return (uchar *)0x0;
      }
      iVar16 = sVar19 * sVar20;
      puVar35 = (uchar *)malloc((long)(iVar16 * 4));
      if (puVar35 != (uchar *)0x0) {
        if (uVar23 == 0) {
          uVar40 = 0;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          puVar31 = puVar35;
          for (; uVar40 != 4; uVar40 = uVar40 + 1) {
            if (uVar63 < uVar40) {
              for (lVar30 = 0; iVar16 != (int)lVar30; lVar30 = lVar30 + 1) {
                puVar31[lVar30 * 4] = -(uVar40 == 3);
              }
            }
            else {
              for (lVar30 = 0; iVar16 != (int)lVar30; lVar30 = lVar30 + 1) {
                sVar10 = stbi__get8(s);
                puVar31[lVar30 * 4] = sVar10;
              }
            }
            puVar31 = puVar31 + 1;
          }
        }
        else {
          stbi__skip(s,uVar63 * sVar19 * 2);
          iVar57 = 0;
          if (0 < iVar16) {
            iVar57 = iVar16;
          }
          local_4a08 = puVar35;
          for (uVar40 = 0; uVar40 != 4; uVar40 = uVar40 + 1) {
            if (uVar40 < uVar63) {
              psVar37 = puVar35 + uVar40;
              iVar22 = 0;
              while (iVar22 < iVar16) {
                bVar8 = stbi__get8(s);
                if (bVar8 != 0x80) {
                  if ((char)bVar8 < '\0') {
                    iVar50 = 0x101 - (uint)bVar8;
                    sVar10 = stbi__get8(s);
                    for (iVar51 = bVar8 - 0x101; iVar51 != 0; iVar51 = iVar51 + 1) {
                      *psVar37 = sVar10;
                      psVar37 = psVar37 + 4;
                    }
                  }
                  else {
                    iVar50 = bVar8 + 1;
                    iVar51 = iVar50;
                    while (bVar66 = iVar51 != 0, iVar51 = iVar51 + -1, bVar66) {
                      sVar10 = stbi__get8(s);
                      *psVar37 = sVar10;
                      psVar37 = psVar37 + 4;
                    }
                  }
                  iVar22 = iVar22 + iVar50;
                }
              }
            }
            else {
              for (lVar30 = 0; iVar57 != (int)lVar30; lVar30 = lVar30 + 1) {
                local_4a08[lVar30 * 4] = -(uVar40 == 3);
              }
            }
            local_4a08 = local_4a08 + 1;
          }
        }
        if (((req_comp & 0xfffffffbU) != 0) &&
           (puVar35 = stbi__convert_format(puVar35,4,req_comp,sVar20,sVar19),
           puVar35 == (uchar *)0x0)) {
          return (uchar *)0x0;
        }
        if (comp != (int *)0x0) {
          *comp = 4;
        }
        *y = sVar19;
        *x = sVar20;
        return puVar35;
      }
      goto LAB_0010d3d9;
    }
    iVar16 = stbi__pic_is4(s,anon_var_dwarf_15434);
    if (iVar16 == 0) {
      s->img_buffer = s->img_buffer_original;
    }
    else {
      iVar16 = 0x54;
      while (bVar66 = iVar16 != 0, iVar16 = iVar16 + -1, bVar66) {
        stbi__get8(s);
      }
      iVar16 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      if (iVar16 != 0) {
        iVar16 = 0x5c;
        while (bVar66 = iVar16 != 0, iVar16 = iVar16 + -1, bVar66) {
          stbi__get8(s);
        }
        uVar63 = stbi__get16be(s);
        uVar23 = stbi__get16be(s);
        iVar16 = stbi__at_eof(s);
        if (iVar16 != 0) {
          stbi__g_failure_reason = "bad file";
          return (uchar *)0x0;
        }
        if ((uint)(0x10000000 / (ulong)uVar63) < uVar23) {
          stbi__g_failure_reason = "too large";
          return (uchar *)0x0;
        }
        bVar8 = 0;
        stbi__get32be(s);
        stbi__get16be(s);
        stbi__get16be(s);
        uVar40 = (ulong)(uVar63 * 4 * uVar23);
        puVar35 = (uchar *)malloc(uVar40);
        memset(puVar35,0xff,uVar40);
        pbVar65 = (byte *)((long)&j.s + 2);
        lVar30 = 0;
        do {
          if (lVar30 == 10) goto LAB_0010d452;
          sVar10 = stbi__get8(s);
          bVar9 = stbi__get8(s);
          pbVar65[-2] = bVar9;
          bVar12 = stbi__get8(s);
          pbVar65[-1] = bVar12;
          bVar12 = stbi__get8(s);
          *pbVar65 = bVar12;
          iVar16 = stbi__at_eof(s);
          if (iVar16 != 0) goto LAB_0010d4e4;
          if (bVar9 != 8) goto LAB_0010d452;
          bVar8 = bVar8 | bVar12;
          pbVar65 = pbVar65 + 3;
          lVar30 = lVar30 + 1;
        } while (sVar10 != '\0');
        *comp = 4 - (uint)((bVar8 & 0x10) == 0);
        for (uVar40 = 0; uVar40 != uVar23; uVar40 = uVar40 + 1) {
          psVar37 = puVar35 + (int)(uVar63 * 4 * (int)uVar40);
          for (lVar54 = 0; lVar30 != lVar54; lVar54 = lVar54 + 1) {
            lVar5 = lVar54 * 3;
            sVar10 = j.huff_dc[0].fast[lVar5 + -7];
            if (sVar10 == '\0') {
              bVar8 = j.huff_dc[0].fast[lVar5 + -6];
              psVar59 = psVar37;
              uVar26 = uVar63;
              while (bVar66 = uVar26 != 0, uVar26 = uVar26 - 1, bVar66) {
                psVar32 = stbi__readval(s,(uint)bVar8,psVar59);
                if (psVar32 == (stbi_uc *)0x0) goto LAB_0010d4f6;
                psVar59 = psVar59 + 4;
              }
            }
            else {
              psVar59 = psVar37;
              uVar26 = uVar63;
              if (sVar10 == '\x01') {
                for (; 0 < (int)uVar26; uVar26 = uVar26 - (uVar25 & 0xff)) {
                  bVar8 = stbi__get8(s);
                  iVar16 = stbi__at_eof(s);
                  if (iVar16 != 0) goto LAB_0010d4e4;
                  psVar32 = stbi__readval(s,(uint)j.huff_dc[0].fast[lVar5 + -6],(stbi_uc *)data);
                  if (psVar32 == (stbi_uc *)0x0) goto LAB_0010d4f6;
                  uVar25 = (uint)bVar8;
                  if (uVar26 < bVar8) {
                    uVar25 = uVar26;
                  }
                  uVar27 = uVar25 & 0xff;
                  while (bVar66 = uVar27 != 0, uVar27 = uVar27 - 1, bVar66) {
                    stbi__copyval((uint)j.huff_dc[0].fast[lVar5 + -6],psVar59,(stbi_uc *)data);
                    psVar59 = psVar59 + 4;
                  }
                }
              }
              else {
                if (sVar10 != '\x02') goto LAB_0010d452;
                for (; 0 < (int)uVar26; uVar26 = uVar26 - iVar16) {
                  bVar8 = stbi__get8(s);
                  iVar16 = stbi__at_eof(s);
                  if (iVar16 != 0) goto LAB_0010d4e4;
                  uVar25 = (uint)bVar8;
                  if ((char)bVar8 < '\0') {
                    if (uVar25 == 0x80) {
                      iVar16 = stbi__get16be(s);
                    }
                    else {
                      iVar16 = uVar25 - 0x7f;
                    }
                    if ((int)uVar26 < iVar16) goto LAB_0010d4e4;
                    psVar32 = stbi__readval(s,(uint)j.huff_dc[0].fast[lVar5 + -6],(stbi_uc *)data);
                    iVar57 = iVar16;
                    if (psVar32 == (stbi_uc *)0x0) goto LAB_0010d4f6;
                    while (iVar57 != 0) {
                      stbi__copyval((uint)j.huff_dc[0].fast[lVar5 + -6],psVar59,(stbi_uc *)data);
                      psVar59 = psVar59 + 4;
                      iVar57 = iVar57 + -1;
                    }
                  }
                  else {
                    iVar16 = bVar8 + 1;
                    iVar57 = iVar16;
                    if (uVar26 <= uVar25) goto LAB_0010d4e4;
                    while (bVar66 = iVar57 != 0, iVar57 = iVar57 + -1, bVar66) {
                      psVar32 = stbi__readval(s,(uint)j.huff_dc[0].fast[lVar5 + -6],psVar59);
                      if (psVar32 == (stbi_uc *)0x0) goto LAB_0010d4f6;
                      psVar59 = psVar59 + 4;
                    }
                  }
                }
              }
            }
          }
        }
        if (puVar35 != (uchar *)0x0) goto LAB_0010d516;
        goto LAB_0010d4f6;
      }
    }
    sVar10 = stbi__get8(s);
    sVar11 = stbi__get8(s);
    if ((sVar10 == 'P') && (0xfd < (byte)(sVar11 - 0x37))) {
      iVar16 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
      if (iVar16 == 0) {
        return (uchar *)0x0;
      }
      *x = s->img_x;
      *y = s->img_y;
      iVar16 = s->img_n;
      *comp = iVar16;
      uVar63 = iVar16 * s->img_x * s->img_y;
      puVar35 = (uchar *)malloc((ulong)uVar63);
      if (puVar35 != (uchar *)0x0) {
        stbi__getn(s,puVar35,uVar63);
        if (req_comp == 0) {
          return puVar35;
        }
        iVar16 = s->img_n;
        if (iVar16 != req_comp) {
          puVar35 = stbi__convert_format(puVar35,iVar16,req_comp,s->img_x,s->img_y);
          return puVar35;
        }
        return puVar35;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
      iVar16 = stbi__hdr_test(s);
      if (iVar16 == 0) {
        stbi__get8(s);
        bVar8 = stbi__get8(s);
        if ((bVar8 < 2) && (bVar8 = stbi__get8(s), 0xfc < (byte)((bVar8 & 0xf7) - 4))) {
          stbi__get16be(s);
          stbi__get16be(s);
          stbi__get8(s);
          stbi__get16be(s);
          stbi__get16be(s);
          iVar16 = stbi__get16be(s);
          if ((iVar16 != 0) && (iVar16 = stbi__get16be(s), iVar16 != 0)) {
            sVar10 = stbi__get8(s);
            s->img_buffer = s->img_buffer_original;
            if ((sVar10 - 8 & 0xe7) == 0) {
              bVar8 = stbi__get8(s);
              sVar10 = stbi__get8(s);
              bVar9 = stbi__get8(s);
              iVar16 = stbi__get16le(s);
              uVar23 = stbi__get16le(s);
              bVar12 = stbi__get8(s);
              stbi__get16le(s);
              stbi__get16le(s);
              uVar26 = stbi__get16le(s);
              uVar25 = stbi__get16le(s);
              bVar13 = stbi__get8(s);
              bVar14 = stbi__get8(s);
              uVar63 = bVar9 - 8;
              if (bVar9 < 8) {
                uVar63 = (uint)bVar9;
              }
              if (uVar26 == 0) {
                return (uchar *)0x0;
              }
              if (uVar25 == 0) {
                return (uchar *)0x0;
              }
              if (uVar63 - 4 < 0xfffffffd) {
                return (uchar *)0x0;
              }
              if (3 < (byte)(bVar13 << 5 | (byte)(bVar13 - 8) >> 3)) {
                return (uchar *)0x0;
              }
              uVar27 = (uint)(bVar13 >> 3);
              uVar63 = (uint)(bVar12 >> 3);
              if (sVar10 == '\0') {
                uVar63 = uVar27;
              }
              uVar40 = (ulong)uVar63;
              *x = uVar26;
              *y = uVar25;
              if (comp != (int *)0x0) {
                *comp = uVar63;
              }
              uVar48 = (ulong)(uVar25 * uVar26);
              puVar35 = (uchar *)malloc(uVar40 * uVar48);
              if (puVar35 != (uchar *)0x0) {
                stbi__skip(s,(uint)bVar8);
                if (bVar9 < 8 && sVar10 == '\0') {
                  uVar28 = 0;
                  uVar23 = uVar25;
                  while (uVar23 = uVar23 - 1, uVar23 != 0xffffffff) {
                    uVar47 = uVar28;
                    if ((bVar14 >> 5 & 1) == 0) {
                      uVar47 = uVar23;
                    }
                    stbi__getn(s,puVar35 + (int)(uVar47 * uVar27 * uVar26),uVar27 * uVar26);
                    uVar28 = uVar28 + 1;
                  }
                }
                else {
                  if (sVar10 == '\0') {
                    local_49e8 = (stbi_uc *)0x0;
                  }
                  else {
                    stbi__skip(s,iVar16);
                    uVar28 = bVar12 * uVar23 >> 3;
                    local_49e8 = (stbi_uc *)malloc((ulong)uVar28);
                    if (local_49e8 == (stbi_uc *)0x0) {
                      free(puVar35);
                      goto LAB_0010e7d6;
                    }
                    iVar16 = stbi__getn(s,local_49e8,uVar28);
                    if (iVar16 == 0) {
                      free(puVar35);
                      free(local_49e8);
                      stbi__g_failure_reason = "bad palette";
                      return (uchar *)0x0;
                    }
                  }
                  uVar61 = (ulong)(bVar13 + 7 >> 3);
                  bVar66 = true;
                  iVar16 = 0;
                  uVar28 = 0;
                  puVar31 = puVar35;
                  for (uVar53 = 0; uVar53 != uVar48; uVar53 = uVar53 + 1) {
                    if (bVar9 < 8) {
LAB_0010e65f:
                      if (sVar10 == '\0') {
                        for (uVar41 = 0; uVar61 != uVar41; uVar41 = uVar41 + 1) {
                          sVar11 = stbi__get8(s);
                          j.huff_dc[0].fast[uVar41 - 8] = sVar11;
                        }
                      }
                      else {
                        bVar8 = stbi__get8(s);
                        uVar47 = (uint)bVar8;
                        if (uVar23 <= bVar8) {
                          uVar47 = 0;
                        }
                        for (uVar41 = 0; uVar61 != uVar41; uVar41 = uVar41 + 1) {
                          j.huff_dc[0].fast[uVar41 - 8] = local_49e8[uVar41 + uVar47 * uVar27];
                        }
                      }
                    }
                    else {
                      if (iVar16 == 0) {
                        bVar8 = stbi__get8(s);
                        iVar16 = (bVar8 & 0x7f) + 1;
                        uVar28 = (uint)(bVar8 >> 7);
                        goto LAB_0010e65f;
                      }
                      if (uVar28 == 0 || bVar66) {
                        uVar28 = (uint)(uVar28 != 0);
                        goto LAB_0010e65f;
                      }
                      uVar28 = 1;
                    }
                    for (uVar41 = 0; uVar40 != uVar41; uVar41 = uVar41 + 1) {
                      puVar31[uVar41] = j.huff_dc[0].fast[uVar41 - 8];
                    }
                    iVar16 = iVar16 + -1;
                    puVar31 = puVar31 + uVar40;
                    bVar66 = false;
                  }
                  if ((bVar14 >> 5 & 1) == 0) {
                    iVar16 = uVar26 * uVar63;
                    iVar57 = (uVar25 - 1) * iVar16;
                    uVar23 = 0;
                    for (uVar27 = 0; uVar27 != uVar25 + 1 >> 1; uVar27 = uVar27 + 1) {
                      puVar31 = puVar35;
                      for (iVar22 = iVar16; 0 < iVar22; iVar22 = iVar22 + -1) {
                        uVar15 = puVar31[uVar23];
                        puVar31[uVar23] = puVar31[iVar57];
                        puVar31[iVar57] = uVar15;
                        puVar31 = puVar31 + 1;
                      }
                      uVar23 = uVar23 + iVar16;
                      iVar57 = iVar57 - iVar16;
                    }
                  }
                  free(local_49e8);
                }
                if (2 < uVar63) {
                  puVar31 = puVar35 + 2;
                  while (iVar16 = (int)uVar48, uVar48 = (ulong)(iVar16 - 1), iVar16 != 0) {
                    uVar2 = puVar31[-2];
                    puVar31[-2] = *puVar31;
                    *puVar31 = uVar2;
                    puVar31 = puVar31 + uVar40;
                  }
                }
                if (req_comp != 0) {
                  if (uVar63 != req_comp) {
                    puVar35 = stbi__convert_format(puVar35,uVar63,req_comp,uVar26,uVar25);
                    return puVar35;
                  }
                  return puVar35;
                }
                return puVar35;
              }
LAB_0010e7d6:
              stbi__g_failure_reason = "outofmem";
              return (uchar *)0x0;
            }
          }
        }
        stbi__g_failure_reason = "unknown image type";
        return (uchar *)0x0;
      }
      __ptr = stbi__hdr_load(s,x,y,comp,req_comp);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar63 = *y * *x;
      puVar35 = (uchar *)malloc((long)(int)(req_comp * uVar63));
      if (puVar35 != (uchar *)0x0) {
        uVar23 = (req_comp + (req_comp & 1U)) - 1;
        uVar48 = 0;
        uVar40 = (ulong)uVar23;
        if ((int)uVar23 < 1) {
          uVar40 = uVar48;
        }
        lVar30 = (long)req_comp;
        pfVar46 = __ptr;
        puVar31 = puVar35;
        uVar53 = (ulong)uVar63;
        if ((int)uVar63 < 1) {
          uVar53 = uVar48;
        }
        for (; uVar48 != uVar53; uVar48 = uVar48 + 1) {
          for (uVar61 = 0; uVar40 != uVar61; uVar61 = uVar61 + 1) {
            fVar67 = powf(pfVar46[uVar61] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
            fVar68 = fVar67 * 255.0 + 0.5;
            fVar67 = 0.0;
            if (0.0 <= fVar68) {
              fVar67 = fVar68;
            }
            fVar68 = 255.0;
            if (fVar67 <= 255.0) {
              fVar68 = fVar67;
            }
            puVar31[uVar61] = (char)(int)fVar68;
          }
          if ((int)uVar40 < req_comp) {
            lVar54 = uVar48 * lVar30 + uVar40;
            fVar68 = __ptr[lVar54] * 255.0 + 0.5;
            fVar67 = 0.0;
            if (0.0 <= fVar68) {
              fVar67 = fVar68;
            }
            fVar68 = 255.0;
            if (fVar67 <= 255.0) {
              fVar68 = fVar67;
            }
            puVar35[lVar54] = (char)(int)fVar68;
          }
          pfVar46 = pfVar46 + lVar30;
          puVar31 = puVar31 + lVar30;
        }
        free(__ptr);
        return puVar35;
      }
      free(__ptr);
    }
    goto LAB_0010d3d9;
  }
  stbi__get32le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  stbi__get32le(s);
  sVar19 = stbi__get32le(s);
  if (((sVar19 < 0x39) && ((0x100010000001000U >> ((ulong)sVar19 & 0x3f) & 1) != 0)) ||
     (sVar19 == 0x6c)) {
    s->img_buffer = s->img_buffer_original;
  }
  else {
    s->img_buffer = s->img_buffer_original;
    if (sVar19 != 0x7c) goto LAB_0010c447;
  }
  sVar10 = stbi__get8(s);
  if ((sVar10 != 'B') || (sVar10 = stbi__get8(s), sVar10 != 'M')) {
    stbi__g_failure_reason = "not BMP";
    return (uchar *)0x0;
  }
  stbi__get32le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  sVar19 = stbi__get32le(s);
  sVar20 = stbi__get32le(s);
  if ((((0x38 < sVar20) || ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) == 0)) &&
      (sVar20 != 0x6c)) && (sVar20 != 0x7c)) {
    stbi__g_failure_reason = "unknown BMP";
    return (uchar *)0x0;
  }
  if (sVar20 == 0xc) {
    sVar21 = stbi__get16le(s);
    s->img_x = sVar21;
    sVar21 = stbi__get16le(s);
  }
  else {
    sVar21 = stbi__get32le(s);
    s->img_x = sVar21;
    sVar21 = stbi__get32le(s);
  }
  s->img_y = sVar21;
  iVar16 = stbi__get16le(s);
  if (iVar16 != 1) goto LAB_0010df71;
  uVar63 = stbi__get16le(s);
  if (uVar63 == 1) {
    stbi__g_failure_reason = "monochrome";
    return (uchar *)0x0;
  }
  sVar21 = s->img_y;
  sVar24 = -sVar21;
  if (0 < (int)sVar21) {
    sVar24 = sVar21;
  }
  s->img_y = sVar24;
  if (sVar20 == 0xc) {
    z = 0;
    if (uVar63 < 0x18) {
      uVar40 = (long)(int)(sVar19 - 0x26) / 3 & 0xffffffff;
    }
    else {
      uVar40 = 0;
    }
    uVar23 = 0;
    uVar26 = 0;
    uVar25 = 0;
  }
  else {
    sVar24 = stbi__get32le(s);
    if (sVar24 - 1 < 2) {
      stbi__g_failure_reason = "BMP RLE";
      return (uchar *)0x0;
    }
    stbi__get32le(s);
    stbi__get32le(s);
    stbi__get32le(s);
    stbi__get32le(s);
    stbi__get32le(s);
    if (sVar20 == 0x28) {
LAB_0010d71d:
      if (uVar63 != 0x20) {
        z = 0;
        uVar23 = 0;
        uVar26 = 0;
        uVar25 = 0;
        if (uVar63 != 0x10) goto LAB_0010db09;
      }
      if (sVar24 != 3) {
        if (sVar24 != 0) {
LAB_0010df71:
          stbi__g_failure_reason = "bad BMP";
          return (uchar *)0x0;
        }
        bVar66 = uVar63 != 0x20;
        uVar23 = 0x1f;
        if (!bVar66) {
          uVar23 = 0xff;
        }
        uVar26 = 0x3e0;
        if (!bVar66) {
          uVar26 = 0xff00;
        }
        uVar25 = 0x7c00;
        if (!bVar66) {
          uVar25 = 0xff0000;
        }
        z = (uint)bVar66 * 0x1000000 - 0x1000000;
        goto LAB_0010db1e;
      }
      uVar25 = stbi__get32le(s);
      uVar26 = stbi__get32le(s);
      uVar23 = stbi__get32le(s);
      if (uVar26 == uVar23 && uVar25 == uVar26) goto LAB_0010df71;
      uVar40 = 0;
      z = 0;
    }
    else {
      if (sVar20 == 0x38) {
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        goto LAB_0010d71d;
      }
      uVar25 = stbi__get32le(s);
      uVar26 = stbi__get32le(s);
      uVar23 = stbi__get32le(s);
      z = stbi__get32le(s);
      stbi__get32le(s);
      iVar16 = 0xc;
      while (bVar66 = iVar16 != 0, iVar16 = iVar16 + -1, bVar66) {
        stbi__get32le(s);
      }
      if (sVar20 == 0x7c) {
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
      }
LAB_0010db09:
      if (uVar63 < 0x10) {
        uVar40 = (ulong)(uint)((int)((sVar19 - sVar20) + -0xe) >> 2);
      }
      else {
LAB_0010db1e:
        uVar40 = 0;
      }
    }
  }
  iVar16 = 4 - (uint)(z == 0);
  s->img_n = iVar16;
  if (2 < req_comp) {
    iVar16 = req_comp;
  }
  puVar35 = (uchar *)malloc((ulong)(s->img_x * iVar16 * s->img_y));
  if (puVar35 == (uchar *)0x0) {
LAB_0010d3d9:
    stbi__g_failure_reason = "outofmem";
    return (uchar *)0x0;
  }
  if (uVar63 < 0x10) {
    iVar57 = (int)uVar40;
    if (0x100 < iVar57 || iVar57 == 0) {
      free(puVar35);
      stbi__g_failure_reason = "invalid";
      return (uchar *)0x0;
    }
    uVar53 = 0;
    uVar48 = 0;
    if (0 < iVar57) {
      uVar48 = uVar40;
    }
    for (; uVar48 != uVar53; uVar53 = uVar53 + 1) {
      sVar10 = stbi__get8(s);
      j.huff_dc[0].fast[uVar53 * 4 + -6] = sVar10;
      sVar10 = stbi__get8(s);
      j.huff_dc[0].fast[uVar53 * 4 + -7] = sVar10;
      sVar10 = stbi__get8(s);
      j.huff_dc[0].fast[uVar53 * 4 + -8] = sVar10;
      if (sVar20 != 0xc) {
        stbi__get8(s);
      }
      j.huff_dc[0].fast[uVar53 * 4 + -5] = 0xff;
    }
    stbi__skip(s,(sVar19 - sVar20) + iVar57 * (sVar20 == 0xc | 0xfffffffc) + -0xe);
    if (uVar63 == 4) {
      sVar19 = s->img_x + 1 >> 1;
    }
    else {
      if (uVar63 != 8) {
        free(puVar35);
        stbi__g_failure_reason = "bad bpp";
        return (uchar *)0x0;
      }
      sVar19 = s->img_x;
    }
    uVar40 = 0;
    local_49e0 = -sVar19 & 3;
    for (iVar57 = 0; sVar19 = s->img_y, iVar57 < (int)sVar19; iVar57 = iVar57 + 1) {
      for (iVar22 = 0; iVar22 < (int)s->img_x; iVar22 = iVar22 + 2) {
        bVar8 = stbi__get8(s);
        uVar23 = (uint)(bVar8 >> 4);
        if (uVar63 != 4) {
          uVar23 = (uint)bVar8;
        }
        uVar48 = (ulong)uVar23;
        uVar23 = bVar8 & 0xf;
        if (uVar63 != 4) {
          uVar23 = 0;
        }
        lVar30 = (long)(int)uVar40;
        uVar53 = lVar30 + 3;
        puVar35[lVar30] = j.huff_dc[0].fast[uVar48 * 4 + -8];
        puVar35[lVar30 + 1] = j.huff_dc[0].fast[uVar48 * 4 + -7];
        puVar35[lVar30 + 2] = j.huff_dc[0].fast[uVar48 * 4 + -6];
        if (iVar16 == 4) {
          puVar35[lVar30 + 3] = 0xff;
          uVar53 = (ulong)((int)uVar40 + 4);
        }
        if (iVar22 + 1U == s->img_x) {
          uVar40 = uVar53 & 0xffffffff;
          break;
        }
        if (uVar63 == 8) {
          bVar8 = stbi__get8(s);
          uVar23 = (uint)bVar8;
        }
        lVar30 = (long)(int)uVar53;
        uVar40 = lVar30 + 3;
        uVar48 = (ulong)uVar23;
        puVar35[lVar30] = j.huff_dc[0].fast[uVar48 * 4 + -8];
        puVar35[lVar30 + 1] = j.huff_dc[0].fast[uVar48 * 4 + -7];
        puVar35[lVar30 + 2] = j.huff_dc[0].fast[uVar48 * 4 + -6];
        if (iVar16 == 4) {
          puVar35[lVar30 + 3] = 0xff;
          uVar40 = (ulong)((int)uVar53 + 4);
        }
      }
      stbi__skip(s,local_49e0);
    }
    goto LAB_0010e1ba;
  }
  stbi__skip(s,(sVar19 - sVar20) + -0xe);
  if (uVar63 == 0x20) {
    local_4994 = 0;
    if (((z == 0xff000000) && (uVar23 == 0xff)) && ((uVar26 == 0xff00 && (uVar25 == 0xff0000)))) {
      bVar66 = true;
      goto LAB_0010dd01;
    }
LAB_0010df82:
    if (((uVar23 == 0) || (uVar26 == 0)) || (uVar25 == 0)) {
      free(puVar35);
      stbi__g_failure_reason = "bad masks";
      return (uchar *)0x0;
    }
    iVar57 = stbi__high_bit(uVar25);
    iVar57 = iVar57 + -7;
    local_49b4 = stbi__bitcount(uVar25);
    iVar22 = stbi__high_bit(uVar26);
    iVar22 = iVar22 + -7;
    local_497c = stbi__bitcount(uVar26);
    iVar50 = stbi__high_bit(uVar23);
    iVar50 = iVar50 + -7;
    local_4984 = stbi__bitcount(uVar23);
    local_4988 = stbi__high_bit(z);
    local_4988 = local_4988 + -7;
    local_498c = stbi__bitcount(z);
    bVar55 = true;
    bVar66 = false;
  }
  else {
    if (uVar63 != 0x18) {
      local_4994 = 0;
      if (uVar63 == 0x10) {
        local_4994 = s->img_x * 2 & 2;
      }
      goto LAB_0010df82;
    }
    local_4994 = s->img_x & 3;
    bVar66 = false;
LAB_0010dd01:
    bVar55 = false;
    iVar57 = 0;
    iVar22 = 0;
    iVar50 = 0;
    local_4988 = 0;
    local_49b4 = 0;
    local_497c = 0;
    local_4984 = 0;
    local_498c = 0;
  }
  iVar17 = 0;
  for (iVar51 = 0; sVar19 = s->img_y, iVar51 < (int)sVar19; iVar51 = iVar51 + 1) {
    if (bVar55) {
      for (iVar60 = 0; iVar60 < (int)s->img_x; iVar60 = iVar60 + 1) {
        if (uVar63 == 0x10) {
          uVar27 = stbi__get16le(s);
        }
        else {
          uVar27 = stbi__get32le(s);
        }
        iVar18 = stbi__shiftsigned(uVar27 & uVar25,iVar57,local_49b4);
        puVar35[iVar17] = (char)iVar18;
        iVar18 = stbi__shiftsigned(uVar27 & uVar26,iVar22,local_497c);
        puVar35[(long)iVar17 + 1] = (char)iVar18;
        iVar18 = stbi__shiftsigned(uVar27 & uVar23,iVar50,local_4984);
        puVar35[(long)iVar17 + 2] = (char)iVar18;
        if (z == 0) {
          uVar15 = 0xff;
        }
        else {
          iVar18 = stbi__shiftsigned(uVar27 & z,local_4988,local_498c);
          uVar15 = (undefined1)iVar18;
        }
        iVar18 = iVar17 + 3;
        if (iVar16 == 4) {
          puVar35[(long)iVar17 + 3] = uVar15;
          iVar18 = iVar17 + 4;
        }
        iVar17 = iVar18;
      }
    }
    else {
      for (iVar60 = 0; iVar60 < (int)s->img_x; iVar60 = iVar60 + 1) {
        sVar10 = stbi__get8(s);
        puVar35[(long)iVar17 + 2] = sVar10;
        sVar10 = stbi__get8(s);
        puVar35[(long)iVar17 + 1] = sVar10;
        sVar10 = stbi__get8(s);
        puVar35[iVar17] = sVar10;
        sVar10 = 0xff;
        if (bVar66) {
          sVar10 = stbi__get8(s);
        }
        iVar18 = iVar17 + 3;
        if (iVar16 == 4) {
          puVar35[(long)iVar17 + 3] = sVar10;
          iVar18 = iVar17 + 4;
        }
        iVar17 = iVar18;
      }
    }
    stbi__skip(s,local_4994);
  }
LAB_0010e1ba:
  if (0 < (int)sVar21) {
    iVar57 = (int)sVar19 >> 1;
    if ((int)sVar19 >> 1 < 1) {
      iVar57 = 0;
    }
    iVar51 = (sVar19 - 1) * iVar16;
    iVar22 = 0;
    for (iVar50 = 0; iVar50 != iVar57; iVar50 = iVar50 + 1) {
      sVar20 = s->img_x;
      uVar40 = (ulong)(sVar20 * iVar16);
      if ((int)(sVar20 * iVar16) < 1) {
        uVar40 = 0;
      }
      for (uVar48 = 0; uVar40 != uVar48; uVar48 = uVar48 + 1) {
        uVar15 = puVar35[uVar48 + sVar20 * iVar22];
        puVar35[uVar48 + sVar20 * iVar22] = puVar35[uVar48 + sVar20 * iVar51];
        puVar35[uVar48 + sVar20 * iVar51] = uVar15;
      }
      iVar51 = iVar51 - iVar16;
      iVar22 = iVar22 + iVar16;
    }
  }
  uVar63 = s->img_x;
  if ((req_comp != 0) && (iVar16 != req_comp)) {
    puVar35 = stbi__convert_format(puVar35,iVar16,req_comp,uVar63,sVar19);
    if (puVar35 == (uchar *)0x0) {
      return (uchar *)0x0;
    }
    uVar63 = s->img_x;
  }
  *x = uVar63;
  *y = s->img_y;
  if (comp != (int *)0x0) {
    *comp = s->img_n;
    return puVar35;
  }
  return puVar35;
LAB_0010c287:
  bVar66 = false;
LAB_0010c289:
  if (!bVar66) goto LAB_0010d3f3;
LAB_0010c298:
  if (j.marker == 0xff) {
    do {
      iVar16 = stbi__at_eof(j.s);
      if (iVar16 != 0) goto LAB_0010b6d5;
      sVar10 = stbi__get8(j.s);
    } while (sVar10 == '\0');
    if (sVar10 != 0xff) {
      stbi__g_failure_reason = "junk before marker";
      goto LAB_0010d3f3;
    }
    j.marker = stbi__get8(j.s);
  }
LAB_0010b6d5:
  bVar8 = stbi__get_marker(&j);
  goto LAB_0010b6ad;
LAB_0010c980:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0010d3f3;
LAB_0010e535:
  do {
    stbi__skip(s,uVar47);
    bVar8 = stbi__get8(s);
    uVar47 = (uint)bVar8;
  } while (bVar8 != 0);
LAB_0010e54e:
  if (j.huff_dc[0].fast._0_8_ != 0) {
    psVar38 = (stbi__context *)j.huff_dc[0].fast._0_8_;
    if ((req_comp & 0xfffffffbU) != 0) {
      psVar38 = (stbi__context *)
                stbi__convert_format
                          ((uchar *)j.huff_dc[0].fast._0_8_,4,req_comp,(uint)j.s,j.s._4_4_);
    }
    goto LAB_0010d7b6;
  }
  goto LAB_0010ca6b;
LAB_0010d452:
  stbi__g_failure_reason = "bad format";
  goto LAB_0010d4f6;
LAB_0010d4e4:
  stbi__g_failure_reason = "bad file";
LAB_0010d4f6:
  free(puVar35);
  puVar35 = (uchar *)0x0;
LAB_0010d516:
  *x = uVar63;
  *y = uVar23;
  if (req_comp == 0) {
    req_comp = *comp;
  }
  puVar35 = stbi__convert_format(puVar35,4,req_comp,uVar63,uVar23);
  return puVar35;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}